

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_test.cpp
# Opt level: O1

void __thiscall raw_test::on_end_of_content(raw_test *this)

{
  int iVar1;
  context *this_00;
  test_data *ptVar2;
  long *plVar3;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_00 = (context *)cppcms::application::context();
  ptVar2 = cppcms::http::context::get_specific<raw_test::test_data>(this_00);
  ptVar2->on_end_of_content = ptVar2->on_end_of_content + 1;
  cppcms::application::request();
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"fail","");
  cppcms::http::request::get((string *)local_48);
  iVar1 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (iVar1 == 0) {
    cppcms::application::request();
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"abort","");
    cppcms::http::request::get((string *)local_48);
    iVar1 = std::__cxx11::string::compare((char *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
    if (iVar1 == 0) {
      basic_test::do_abort(&this->super_basic_test,0x1f7);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"FAIL: request().get(\"fail\")==\"\" in line: ",0x29);
    plVar3 = (long *)std::ostream::operator<<(&std::cerr,0xf4);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    g_fail = 1;
  }
  return;
}

Assistant:

void on_end_of_content(){
		data()->on_end_of_content++;
		TESTNT(request().get("fail")=="");
		if(request().get("abort")=="on_end_of_content")
			do_abort(503);

	}